

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

char * fmt::v8::detail::
       parse_align<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::specs_handler<char>_> *handler)

{
  char cVar1;
  basic_format_specs<char> *pbVar2;
  ulong uVar3;
  char *pcVar4;
  align_t align;
  size_t i;
  ulong uVar5;
  bool bVar6;
  error_handler local_11;
  
  pcVar4 = begin + (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                 [(byte)*begin >> 3] == 0) +
                   (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                         [(byte)*begin >> 3];
  if (end <= begin + (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                   [(byte)*begin >> 3] == 0) +
                     (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                           [(byte)*begin >> 3]) {
    pcVar4 = begin;
  }
  do {
    cVar1 = *pcVar4;
    if (cVar1 == '^') {
      align = center;
LAB_001287f6:
      uVar3 = (long)pcVar4 - (long)begin;
      if (uVar3 != 0) {
        if (*begin == 0x7b) {
          error_handler::on_error(&local_11,"invalid fill character \'{\'");
        }
        if (4 < uVar3) {
          throw_format_error("invalid fill");
        }
        pbVar2 = (handler->super_specs_handler<char>).super_specs_setter<char>.specs_;
        uVar5 = 0;
        do {
          (pbVar2->fill).data_[uVar5] = begin[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
        (pbVar2->fill).size_ = (uchar)uVar3;
        begin = pcVar4;
      }
      specs_checker<fmt::v8::detail::specs_handler<char>_>::on_align(handler,align);
      return begin + 1;
    }
    if (cVar1 == '>') {
      align = right;
      goto LAB_001287f6;
    }
    if (cVar1 == '<') {
      align = left;
      goto LAB_001287f6;
    }
    bVar6 = pcVar4 == begin;
    pcVar4 = begin;
    if (bVar6) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR auto parse_align(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = begin + code_point_length(begin);
  if (p >= end) p = begin;
  for (;;) {
    switch (to_ascii(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
    case '^':
      align = align::center;
      break;
    default:
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}